

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balk.cpp
# Opt level: O2

void __thiscall
Balk::add_concentrated_power(Balk *this,int shift,double segment_length,double value)

{
  int local_4c;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  shared_ptr<Term> local_38;
  double local_28;
  double local_20;
  
  local_4c = shift;
  local_28 = value;
  local_20 = segment_length;
  std::make_shared<ConcentratedPower,int&,double&,double&>
            ((int *)&local_48,(double *)&local_4c,&local_20);
  local_38.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
  local_38.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Stack_40._M_pi;
  local_48 = (element_type *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>>::
  emplace_back<std::shared_ptr<Term>>
            ((vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>> *)&this->terms,
             &local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  return;
}

Assistant:

void Balk::add_concentrated_power(int shift, double segment_length, double value)
{
    terms.push_back(std::make_shared<ConcentratedPower>(shift, segment_length, value));
}